

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textrender.cpp
# Opt level: O3

void __thiscall CTextRender::TextRefreshGlyphs(CTextRender *this,CTextCursor *pCursor)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  int i;
  long lVar4;
  
  if ((0 < (pCursor->m_Glyphs).num_elements) &&
     (uVar1 = this->m_pGlyphMap->m_NumTotalPages, uVar1 != pCursor->m_PageCountWhenDrawn)) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      CGlyphMap::RenderGlyph
                (this->m_pGlyphMap,*(CGlyph **)((long)&((pCursor->m_Glyphs).list)->m_pGlyph + lVar3)
                 ,true);
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x40;
    } while (lVar4 < (pCursor->m_Glyphs).num_elements);
    uVar2 = this->m_pGlyphMap->m_NumTotalPages;
    pCursor->m_PageCountWhenDrawn = uVar2;
    if (uVar1 != uVar2) {
      dbg_msg("textrender","page %d mismatch after refresh, atlas might be too small.",(ulong)uVar1)
      ;
      return;
    }
  }
  return;
}

Assistant:

void CTextRender::TextRefreshGlyphs(CTextCursor *pCursor)
{
	int NumQuads = pCursor->m_Glyphs.size();
	if(NumQuads <= 0)
		return;

	int NumTotalPages = m_pGlyphMap->NumTotalPages();

	if(NumTotalPages != pCursor->m_PageCountWhenDrawn)
	{
		// pages were dropped, re-render glyphs
		for(int i = 0; i < pCursor->m_Glyphs.size(); ++i)
			m_pGlyphMap->RenderGlyph(pCursor->m_Glyphs[i].m_pGlyph, true);
		pCursor->m_PageCountWhenDrawn = m_pGlyphMap->NumTotalPages();
	}

	if(NumTotalPages != m_pGlyphMap->NumTotalPages())
	{
		dbg_msg("textrender", "page %d mismatch after refresh, atlas might be too small.", NumTotalPages);
	}
}